

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

RuntimeError * __thiscall
jsonnet::internal::anon_unknown_0::Stack::makeError
          (RuntimeError *__return_storage_ptr__,Stack *this,LocationRange *loc,string *msg)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  RuntimeError *pRVar4;
  uint uVar5;
  int iVar6;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_type *psVar11;
  ulong *puVar12;
  pointer pFVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  ulong uVar16;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> stack_trace;
  string name;
  string local_150;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  Stack *local_110;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> local_108;
  TraceFrame local_f0;
  string *local_90;
  RuntimeError *local_88;
  pointer local_80;
  ulong local_78;
  long local_70;
  string local_68;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> local_48;
  
  local_108.
  super__Vector_base<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_110 = this;
  local_90 = msg;
  local_88 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
  TraceFrame::TraceFrame(&local_f0,loc,&local_150);
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
  emplace_back<jsonnet::internal::TraceFrame>(&local_108,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.name._M_dataplus._M_p != &local_f0.name.field_2) {
    operator_delete(local_f0.name._M_dataplus._M_p,local_f0.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.location.file._M_dataplus._M_p != &local_f0.location.file.field_2) {
    operator_delete(local_f0.location.file._M_dataplus._M_p,
                    CONCAT71(local_f0.location.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.location.file.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  uVar5 = (int)((ulong)((long)(local_110->stack).
                              super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_110->stack).
                             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x3d70a3d7 - 1;
  if (-1 < (int)uVar5) {
    uVar16 = (ulong)uVar5;
    do {
      pFVar13 = (local_110->stack).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pFVar13[uVar16].kind == FRAME_CALL) {
        pFVar13 = pFVar13 + uVar16;
        if (pFVar13->context != (HeapEntity *)0x0) {
          p_Var1 = (_Base_ptr)pFVar13->context;
          local_f0.location.file._M_string_length = 0;
          local_f0.location.file.field_2._M_local_buf[0] = '\0';
          local_f0.location.file._M_dataplus._M_p = (pointer)&local_f0.location.file.field_2;
          local_80 = pFVar13;
          local_78 = uVar16;
          do {
            if ((int)uVar16 < 1) break;
            pFVar13 = (local_110->stack).
                      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_70 = uVar16 * 400;
            for (p_Var7 = *(_Base_ptr *)((long)&pFVar13[uVar16 - 1].bindings._M_t._M_impl + 0x18);
                p_Var7 != (_Rb_tree_node_base *)
                          ((long)&pFVar13[uVar16 - 1].bindings._M_t._M_impl + 8U);
                p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
              p_Var2 = p_Var7[1]._M_parent;
              if (((*(char *)((long)&p_Var2->_M_parent + 2) == '\x01') &&
                  (((ulong)p_Var2->_M_left & 0x10) != 0)) && (p_Var2->_M_right == p_Var1)) {
                encode_utf8(&local_150,*(UString **)(p_Var7 + 1));
                std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_150);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != &local_150.field_2) {
                  operator_delete(local_150._M_dataplus._M_p,
                                  local_150.field_2._M_allocated_capacity + 1);
                }
              }
            }
            uVar16 = uVar16 - 1;
          } while (*(int *)((long)&pFVar13[-1].kind + local_70) != 6);
          iVar6 = std::__cxx11::string::compare((char *)&local_f0);
          if (iVar6 == 0) {
            std::__cxx11::string::_M_replace
                      ((ulong)&local_f0,0,(char *)local_f0.location.file._M_string_length,0x247622);
          }
          if (p_Var1 == (_Base_ptr)0x0) {
            lVar8 = 0;
LAB_001bf777:
            if (lVar8 == 0) {
              if (p_Var1[3]._M_parent == (_Base_ptr)0x0) {
                std::operator+(&local_150,"builtin function <",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p_Var1[3]._M_left);
                puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
              }
              else {
                std::operator+(&local_150,"function <",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_f0);
                puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
              }
              goto LAB_001bf906;
            }
            if (*(UString **)(lVar8 + 0x20) != (UString *)0x0) {
              encode_utf8(&local_68,*(UString **)(lVar8 + 0x20));
              plVar10 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_68,0,(char *)0x0,0x24762c);
              psVar11 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_150.field_2._M_allocated_capacity = *psVar11;
                local_150.field_2._8_8_ = plVar10[3];
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
              }
              else {
                local_150.field_2._M_allocated_capacity = *psVar11;
                local_150._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_150._M_string_length = plVar10[1];
              *plVar10 = (long)psVar11;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_150);
              puVar12 = (ulong *)(plVar10 + 2);
              if ((ulong *)*plVar10 == puVar12) {
                local_120 = *puVar12;
                lStack_118 = plVar10[3];
                local_130 = &local_120;
              }
              else {
                local_120 = *puVar12;
                local_130 = (ulong *)*plVar10;
              }
              local_128 = plVar10[1];
              *plVar10 = (long)puVar12;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                operator_delete(local_150._M_dataplus._M_p,
                                local_150.field_2._M_allocated_capacity + 1);
              }
              uVar14 = local_68.field_2._M_allocated_capacity;
              _Var15._M_p = local_68._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_001bf95f;
              goto LAB_001bf957;
            }
            local_128 = 0;
            local_120 = local_120 & 0xffffffffffffff00;
            local_130 = &local_120;
          }
          else {
            lVar8 = __dynamic_cast(p_Var1,&(anonymous_namespace)::HeapEntity::typeinfo,
                                   &(anonymous_namespace)::HeapObject::typeinfo,0);
            if (lVar8 == 0) {
              lVar8 = __dynamic_cast(p_Var1,&(anonymous_namespace)::HeapEntity::typeinfo,
                                     &(anonymous_namespace)::HeapThunk::typeinfo,0);
              goto LAB_001bf777;
            }
            std::operator+(&local_150,"object <",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_f0);
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
LAB_001bf906:
            puVar12 = puVar9 + 2;
            if ((ulong *)*puVar9 == puVar12) {
              local_120 = *puVar12;
              lStack_118 = puVar9[3];
              local_130 = &local_120;
            }
            else {
              local_120 = *puVar12;
              local_130 = (ulong *)*puVar9;
            }
            local_128 = puVar9[1];
            *puVar9 = puVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            uVar14 = local_150.field_2._M_allocated_capacity;
            _Var15._M_p = local_150._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
LAB_001bf957:
              operator_delete(_Var15._M_p,uVar14 + 1);
            }
          }
LAB_001bf95f:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0.location.file._M_dataplus._M_p != &local_f0.location.file.field_2) {
            operator_delete(local_f0.location.file._M_dataplus._M_p,
                            CONCAT71(local_f0.location.file.field_2._M_allocated_capacity._1_7_,
                                     local_f0.location.file.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::string::operator=
                    ((string *)
                     &local_108.
                      super__Vector_base<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].name,(string *)&local_130);
          pFVar13 = local_80;
          uVar16 = local_78;
          if (local_130 != &local_120) {
            operator_delete(local_130,local_120 + 1);
            pFVar13 = local_80;
            uVar16 = local_78;
          }
        }
        if (((pFVar13->location).begin.line != 0) ||
           ((pFVar13->location).file._M_string_length != 0)) {
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
          TraceFrame::TraceFrame(&local_f0,&pFVar13->location,&local_150);
          std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
          ::emplace_back<jsonnet::internal::TraceFrame>(&local_108,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0.name._M_dataplus._M_p != &local_f0.name.field_2) {
            operator_delete(local_f0.name._M_dataplus._M_p,
                            local_f0.name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0.location.file._M_dataplus._M_p != &local_f0.location.file.field_2) {
            operator_delete(local_f0.location.file._M_dataplus._M_p,
                            CONCAT71(local_f0.location.file.field_2._M_allocated_capacity._1_7_,
                                     local_f0.location.file.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
        }
      }
      bVar3 = 0 < (long)uVar16;
      uVar16 = uVar16 - 1;
    } while (bVar3);
  }
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::vector
            (&local_48,&local_108);
  pRVar4 = local_88;
  RuntimeError::RuntimeError(local_88,&local_48,local_90);
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
  ~vector(&local_48);
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
  ~vector(&local_108);
  return pRVar4;
}

Assistant:

RuntimeError makeError(const LocationRange &loc, const std::string &msg)
    {
        std::vector<TraceFrame> stack_trace;
        stack_trace.push_back(TraceFrame(loc));
        for (int i = stack.size() - 1; i >= 0; --i) {
            const auto &f = stack[i];
            if (f.isCall()) {
                if (f.context != nullptr) {
                    // Give the last line a name.
                    stack_trace[stack_trace.size() - 1].name = getName(i, f.context);
                }
                if (f.location.isSet() || f.location.file.length() > 0)
                    stack_trace.push_back(TraceFrame(f.location));
            }
        }
        return RuntimeError(stack_trace, msg);
    }